

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QString * QLocale::scriptToCode(QString *__return_storage_ptr__,Script script)

{
  QLatin1StringView latin1;
  
  latin1 = QLocalePrivate::scriptToCode(script);
  QString::QString(__return_storage_ptr__,latin1);
  return __return_storage_ptr__;
}

Assistant:

QString QLocale::scriptToCode(Script script)
{
    return QLocalePrivate::scriptToCode(script);
}